

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall
asmjit::CodeHolder::newNamedLabelId
          (CodeHolder *this,uint32_t *idOut,char *name,size_t nameLength,uint32_t type,
          uint32_t parentId)

{
  ZoneHeap *heap;
  size_t *psVar1;
  ulong uVar2;
  size_t __n;
  uint32_t uVar3;
  int iVar4;
  Error EVar5;
  int iVar6;
  ZoneHashNode *pZVar7;
  undefined4 extraout_var;
  uint32_t uVar8;
  ZoneHashNode *__s1;
  size_t nameLength_local;
  size_t local_38;
  
  *idOut = 0;
  nameLength_local = nameLength;
  uVar3 = anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&nameLength_local);
  __n = nameLength_local;
  if (nameLength_local == 0) {
    EVar5 = 0x11;
  }
  else if (nameLength_local < 0x801) {
    if (type == 2) {
      if (parentId != 0) {
        return 0x13;
      }
    }
    else {
      if (type != 1) {
        return 3;
      }
      if ((this->_labels).super_ZoneVectorBase._length <= (ulong)(parentId - 0x100)) {
        return 0x12;
      }
      uVar3 = uVar3 ^ parentId;
    }
    pZVar7 = (ZoneHashNode *)
             ((this->_namedLabels).super_ZoneHashBase._data +
             (ulong)uVar3 % (ulong)(this->_namedLabels).super_ZoneHashBase._bucketsCount);
    EVar5 = 0xf;
    do {
      do {
        pZVar7 = *(ZoneHashNode **)pZVar7;
        iVar4 = (int)__n;
        if (pZVar7 == (ZoneHashNode *)0x0) {
          uVar2 = (this->_labels).super_ZoneVectorBase._length;
          if (0xfffffe < uVar2 >> 8) {
            return 0xd;
          }
          heap = &this->_baseHeap;
          if (((this->_labels).super_ZoneVectorBase._capacity == uVar2) &&
             (EVar5 = ZoneVectorBase::_grow(&(this->_labels).super_ZoneVectorBase,heap,8,1),
             EVar5 != 0)) {
            return EVar5;
          }
          if (heap->_zone == (Zone *)0x0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/zone.h"
                       ,0x198,"isInitialized()");
          }
          pZVar7 = (ZoneHashNode *)ZoneHeap::_allocZeroed(heap,0x40,&local_38);
          if (pZVar7 != (ZoneHashNode *)0x0) {
            uVar8 = (int)uVar2 + 0x100;
            *(uint32_t *)(pZVar7 + 8) = uVar3;
            *(uint32_t *)(pZVar7 + 0xc) = uVar8;
            pZVar7[0x10] = SUB41(type,0);
            *(undefined8 *)(pZVar7 + 0x14) = 0xffffffff00000000;
            *(undefined8 *)(pZVar7 + 0x20) = 0;
            if (__n < 0xc) {
              *(int *)(pZVar7 + 0x30) = iVar4;
              memcpy(pZVar7 + 0x34,name,__n);
              pZVar7[__n + 0x34] = (ZoneHashNode)0x0;
            }
            else {
              iVar6 = Zone::dup(&this->_dataZone,(int)name);
              if (CONCAT44(extraout_var,iVar6) == 0) {
                return 1;
              }
              *(int *)(pZVar7 + 0x30) = iVar4;
              *(long *)(pZVar7 + 0x38) = CONCAT44(extraout_var,iVar6);
            }
            uVar2 = (this->_labels).super_ZoneVectorBase._length;
            if (uVar2 < (this->_labels).super_ZoneVectorBase._capacity) {
              *(ZoneHashNode **)((long)(this->_labels).super_ZoneVectorBase._data + uVar2 * 8) =
                   pZVar7;
              psVar1 = &(this->_labels).super_ZoneVectorBase._length;
              *psVar1 = *psVar1 + 1;
              ZoneHashBase::_put(&(this->_namedLabels).super_ZoneHashBase,pZVar7);
              *idOut = uVar8;
              return 0;
            }
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/zone.h"
                       ,0x2e3,"_length < _capacity");
          }
          return 1;
        }
      } while (*(int *)(pZVar7 + 0x30) != iVar4);
      if (__n < 0xc) {
        __s1 = pZVar7 + 0x34;
      }
      else {
        __s1 = *(ZoneHashNode **)(pZVar7 + 0x38);
      }
      iVar4 = bcmp(__s1,name,__n);
    } while (iVar4 != 0);
  }
  else {
    EVar5 = 0x10;
  }
  return EVar5;
}

Assistant:

Error CodeHolder::newNamedLabelId(uint32_t& idOut, const char* name, size_t nameLength, uint32_t type, uint32_t parentId) noexcept {
  idOut = 0;
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);

  if (ASMJIT_UNLIKELY(nameLength == 0))
    return DebugUtils::errored(kErrorInvalidLabelName);

  if (ASMJIT_UNLIKELY(nameLength > Globals::kMaxLabelLength))
    return DebugUtils::errored(kErrorLabelNameTooLong);

  switch (type) {
    case Label::kTypeLocal:
      if (ASMJIT_UNLIKELY(Operand::unpackId(parentId) >= _labels.getLength()))
        return DebugUtils::errored(kErrorInvalidParentLabel);

      hVal ^= parentId;
      break;

    case Label::kTypeGlobal:
      if (ASMJIT_UNLIKELY(parentId != 0))
        return DebugUtils::errored(kErrorNonLocalLabelCantHaveParent);

      break;

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  // Don't allow to insert duplicates. Local labels allow duplicates that have
  // different id, this is already accomplished by having a different hashes
  // between the same label names having different parent labels.
  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  if (ASMJIT_UNLIKELY(le))
    return DebugUtils::errored(kErrorLabelAlreadyDefined);

  Error err = kErrorOk;
  size_t index = _labels.getLength();

  if (ASMJIT_UNLIKELY(index >= Operand::kPackedIdCount))
    return DebugUtils::errored(kErrorLabelIndexOverflow);

  ASMJIT_PROPAGATE(_labels.willGrow(&_baseHeap));
  le = _baseHeap.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return  DebugUtils::errored(kErrorNoHeapMemory);

  uint32_t id = Operand::packId(static_cast<uint32_t>(index));
  le->_hVal = hVal;
  le->_setId(id);
  le->_type = static_cast<uint8_t>(type);
  le->_parentId = 0;
  le->_sectionId = SectionEntry::kInvalidId;
  le->_offset = 0;

  if (le->_name.mustEmbed(nameLength)) {
    le->_name.setEmbedded(name, nameLength);
  }
  else {
    char* nameExternal = static_cast<char*>(_dataZone.dup(name, nameLength, true));
    if (ASMJIT_UNLIKELY(!nameExternal))
      return DebugUtils::errored(kErrorNoHeapMemory);
    le->_name.setExternal(nameExternal, nameLength);
  }

  _labels.appendUnsafe(le);
  _namedLabels.put(le);

  idOut = id;
  return err;
}